

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GreaterEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_greaterequal(NeuralNetworkLayer *this)

{
  GreaterEqualLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x340) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x340;
    this_00 = (GreaterEqualLayerParams *)operator_new(0x18);
    GreaterEqualLayerParams::GreaterEqualLayerParams(this_00);
    (this->layer_).greaterequal_ = this_00;
  }
  return (GreaterEqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GreaterEqualLayerParams* NeuralNetworkLayer::mutable_greaterequal() {
  if (!has_greaterequal()) {
    clear_layer();
    set_has_greaterequal();
    layer_.greaterequal_ = new ::CoreML::Specification::GreaterEqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.greaterEqual)
  return layer_.greaterequal_;
}